

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

void __thiscall OpenGliderConnection::RRMain(OpenGliderConnection *this)

{
  byte bVar1;
  undefined1 uVar2;
  ThreadSettings *in_RDI;
  exception *e;
  unique_lock<std::mutex> lk;
  positionTy pos;
  ThreadSettings TS;
  mutex_type *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  byte in_stack_ffffffffffffff26;
  byte in_stack_ffffffffffffff27;
  int in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff4f;
  positionTy *in_stack_ffffffffffffff50;
  int local_a4;
  duration<long,std::ratio<1l,1l>> local_a0 [20];
  int local_8c;
  duration<long,std::ratio<1l,1l>> local_88 [16];
  undefined1 local_78 [72];
  locale_t local_30;
  
  ThreadSettings::ThreadSettings
            (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT24(in_stack_ffffffffffffff2c,
                                                       in_stack_ffffffffffffff28))),
             CONCAT13(in_stack_ffffffffffffff27,
                      CONCAT12(in_stack_ffffffffffffff26,in_stack_ffffffffffffff24)),
             (char *)in_stack_ffffffffffffff18);
  while (bVar1 = (**(code **)(in_RDI->threadLocale + 0x20))(), (bVar1 & 1) != 0) {
    local_30 = (locale_t)std::chrono::_V2::steady_clock::now();
    in_RDI[8].threadLocale = local_30;
    DataRefs::GetViewPos();
    uVar2 = positionTy::isNormal(in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff28 = DataRefs::GetFdRefreshIntvl(&dataRefs);
      local_8c = in_stack_ffffffffffffff28;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_88,&local_8c);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(bVar1,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffff2c,
                                                        in_stack_ffffffffffffff28))));
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT16(in_stack_ffffffffffffff26,
                                        CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ))),(duration *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff27 = (**(code **)(in_RDI->threadLocale + 0x80))(in_RDI,local_78);
      if (((in_stack_ffffffffffffff27 & 1) != 0) &&
         (in_stack_ffffffffffffff26 = (**(code **)(in_RDI->threadLocale + 0x88))(),
         (in_stack_ffffffffffffff26 & 1) != 0)) {
        (**(code **)(in_RDI->threadLocale + 0x48))();
      }
    }
    else {
      local_a4 = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_a0,&local_a4);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(bVar1,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffff2c,
                                                        in_stack_ffffffffffffff28))));
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT16(in_stack_ffffffffffffff26,
                                        CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ))),(duration *)in_stack_ffffffffffffff18);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18);
    std::condition_variable::
    wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,OpenGliderConnection::RRMain()::__0>
              ((condition_variable *)in_RDI,
               (unique_lock<std::mutex> *)
               CONCAT17(bVar1,CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffff2c,
                                                      in_stack_ffffffffffffff28))),
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT17(in_stack_ffffffffffffff27,
                           CONCAT16(in_stack_ffffffffffffff26,
                                    CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff38);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))));
  }
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))));
  return;
}

Assistant:

void OpenGliderConnection::RRMain ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_OGN_RR", LC_ALL_MASK);
    
    while ( shallRun() ) {
        // LiveTraffic Top Level Exception Handling
        try {
            // basis for determining when to be called next
            tNextWakeup = std::chrono::steady_clock::now();
            
            // where are we right now?
            const positionTy pos (dataRefs.GetViewPos());
            
            // If the camera position is valid we can request data around it
            if (pos.isNormal()) {
                // Next wakeup is "refresh interval" from _now_
                tNextWakeup += std::chrono::seconds(dataRefs.GetFdRefreshIntvl());
                // fetch data and process it
                if (FetchAllData(pos) && ProcessFetchedData())
                        // reduce error count if processed successfully
                        // as a chance to appear OK in the long run
                        DecErrCnt();
            }
            else {
                // Camera position is yet invalid, retry in a second
                tNextWakeup += std::chrono::seconds(1);
            }
            
            // sleep for FD_REFRESH_INTVL or if woken up for termination
            // by condition variable trigger
            {
                std::unique_lock<std::mutex> lk(FDThreadSynchMutex);
                FDThreadSynchCV.wait_until(lk, tNextWakeup,
                                           [this]{return !shallRun();});
            }
            
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            IncErrCnt();
        } catch (...) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
            IncErrCnt();
        }
    }
}